

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void __thiscall twitter::zipkin::thrift::Annotation::Annotation(Annotation *this,Annotation *other2)

{
  Annotation *other2_local;
  Annotation *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(undefined ***)this = &PTR__Annotation_004fd618;
  *(undefined ***)this = &PTR__Annotation_004fd618;
  std::__cxx11::string::string((string *)&this->value);
  Endpoint::Endpoint(&this->host);
  _Annotation__isset::_Annotation__isset(&this->__isset);
  this->timestamp = other2->timestamp;
  std::__cxx11::string::operator=((string *)&this->value,(string *)&other2->value);
  Endpoint::operator=(&this->host,&other2->host);
  this->__isset = other2->__isset;
  return;
}

Assistant:

Annotation::Annotation(const Annotation& other2) {
  timestamp = other2.timestamp;
  value = other2.value;
  host = other2.host;
  __isset = other2.__isset;
}